

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperFloatingPointEQ<float>
          (char *expected_expression,char *actual_expression,float expected,float actual)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  internal *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  AssertionResult AVar4;
  stringstream actual_ss;
  stringstream expected_ss;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  FloatingPoint<float> *in_stack_fffffffffffffc20;
  FloatingPoint<float> *in_stack_fffffffffffffc28;
  string local_398;
  string local_378;
  int local_354;
  stringstream local_350 [16];
  ostream local_340 [396];
  int local_1b4;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  FloatingPoint<float> local_28;
  FloatingPoint<float> local_24;
  float local_20;
  float local_1c;
  char *local_18;
  char *local_10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  FloatingPoint<float>::FloatingPoint(&local_24,&local_1c);
  FloatingPoint<float>::FloatingPoint(&local_28,&local_20);
  bVar1 = FloatingPoint<float>::AlmostEquals(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    local_1b4 = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_1a0,(_Setprecision)local_1b4);
    std::ostream::operator<<(poVar2,local_1c);
    std::__cxx11::stringstream::stringstream(local_350);
    local_354 = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_340,(_Setprecision)local_354);
    std::ostream::operator<<(poVar2,local_20);
    StringStreamToString(&local_378,(stringstream *)local_1b0);
    StringStreamToString(&local_398,(stringstream *)local_350);
    EqFailure(in_RDI,local_10,local_18,&local_378,&local_398,false);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::stringstream::~stringstream(local_350);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}